

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O1

void __thiscall
duckdb::DictionaryAnalyzeState::DictionaryAnalyzeState
          (DictionaryAnalyzeState *this,CompressionInfo *info)

{
  Allocator *allocator;
  
  (this->super_DictionaryCompressionState).super_CompressionState._vptr_CompressionState =
       (_func_int **)&PTR__CompressionState_019a4e68;
  (this->super_DictionaryCompressionState).super_CompressionState.info.block_manager =
       info->block_manager;
  (this->super_DictionaryCompressionState).super_CompressionState._vptr_CompressionState =
       (_func_int **)&PTR__DictionaryAnalyzeState_019cab30;
  this->segment_count = 0;
  this->current_tuple_count = 0;
  this->current_unique_count = 0;
  this->current_dict_size = 0;
  allocator = Allocator::DefaultAllocator();
  StringHeap::StringHeap(&this->heap,allocator);
  (this->current_set)._M_h._M_buckets = &(this->current_set)._M_h._M_single_bucket;
  (this->current_set)._M_h._M_bucket_count = 1;
  (this->current_set)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->current_set)._M_h._M_element_count = 0;
  (this->current_set)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->current_set)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->current_set)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->current_width = '\0';
  this->next_width = '\0';
  return;
}

Assistant:

DictionaryAnalyzeState::DictionaryAnalyzeState(const CompressionInfo &info)
    : DictionaryCompressionState(info), segment_count(0), current_tuple_count(0), current_unique_count(0),
      current_dict_size(0), current_width(0), next_width(0) {
}